

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O3

vector<Item,_std::allocator<Item>_> *
getContent(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Item *item)

{
  string *this;
  int iVar1;
  _Base_ptr p_Var2;
  vector<Item,_std::allocator<Item>_> *__x;
  _List_node_base *p_Var3;
  Item i;
  list<Item,_std::allocator<Item>_> l;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  char local_b8 [16];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Base_ptr local_88;
  _Alloc_hider local_80;
  char local_70 [16];
  _Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_> local_60;
  
  this = &item->type;
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this,"Array");
  if ((iVar1 == 0) ||
     (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(this,"MutableArray"), iVar1 == 0)) {
    __x = (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x38);
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this,"ArrayList");
    if ((iVar1 != 0) &&
       (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this,"MutableArrayList"), iVar1 != 0)) {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(this,"List");
      if (iVar1 == 0) {
        std::__cxx11::list<Item,_std::allocator<Item>_>::list
                  ((list<Item,_std::allocator<Item>_> *)&local_60,
                   (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x38));
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((_List_node_base *)local_60._M_impl._0_8_ != (_List_node_base *)&local_60) {
          p_Var3 = (_List_node_base *)local_60._M_impl._0_8_;
          do {
            local_d0._0_4_ = *(undefined4 *)&p_Var3[1]._M_next;
            local_c8._M_p = local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,p_Var3[1]._M_prev,
                       (long)&(p_Var3[1]._M_prev)->_M_next + (long)&(p_Var3[2]._M_next)->_M_next);
            local_a8._M_p = local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,p_Var3[3]._M_prev,
                       (long)&(p_Var3[3]._M_prev)->_M_next + (long)p_Var3[4]._M_next);
            local_88 = (_Base_ptr)p_Var3[5]._M_prev;
            local_80._M_p = local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,p_Var3[6]._M_next,
                       (long)&(p_Var3[6]._M_prev)->_M_next + (long)p_Var3[6]._M_next);
            std::vector<Item,_std::allocator<Item>_>::push_back
                      (__return_storage_ptr__,(Item *)local_d0);
            Item::~Item((Item *)local_d0);
            p_Var3 = (((_List_base<Item,_std::allocator<Item>_> *)&p_Var3->_M_next)->_M_impl).
                     _M_node.super__List_node_base._M_next;
          } while (p_Var3 != (_List_node_base *)&local_60);
        }
      }
      else {
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this,"MutableList");
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(this,"Set");
          if (iVar1 == 0) {
            std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
            ::_Rb_tree(&local_60,
                       (_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                        *)((long)item->value + 0x38));
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
                (_Rb_tree_node_base *)((long)&local_60 + 8U)) {
              p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                local_d0._0_4_ = p_Var2[1]._M_color;
                local_c8._M_p = local_b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c8,p_Var2[1]._M_parent,
                           (long)&(p_Var2[1]._M_parent)->_M_color +
                           (long)&(p_Var2[1]._M_left)->_M_color);
                local_a8._M_p = local_98;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a8,p_Var2[2]._M_parent,
                           (long)&(p_Var2[2]._M_parent)->_M_color +
                           (long)&(p_Var2[2]._M_left)->_M_color);
                local_88 = p_Var2[3]._M_parent;
                local_80._M_p = local_70;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_80,p_Var2[3]._M_left,
                           (long)&(p_Var2[3]._M_left)->_M_color +
                           (long)&(p_Var2[3]._M_right)->_M_color);
                std::vector<Item,_std::allocator<Item>_>::push_back
                          (__return_storage_ptr__,(Item *)local_d0);
                Item::~Item((Item *)local_d0);
                p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
              } while (p_Var2 != (_Rb_tree_node_base *)((long)&local_60 + 8U));
            }
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this,"MutableSet");
            std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
            ::_Rb_tree(&local_60,
                       (_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                        *)((long)item->value + 0x70));
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
                (_Rb_tree_node_base *)((long)&local_60 + 8U)) {
              p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                local_d0._0_4_ = p_Var2[1]._M_color;
                local_c8._M_p = local_b8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c8,p_Var2[1]._M_parent,
                           (long)&(p_Var2[1]._M_parent)->_M_color +
                           (long)&(p_Var2[1]._M_left)->_M_color);
                local_a8._M_p = local_98;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a8,p_Var2[2]._M_parent,
                           (long)&(p_Var2[2]._M_parent)->_M_color +
                           (long)&(p_Var2[2]._M_left)->_M_color);
                local_88 = p_Var2[3]._M_parent;
                local_80._M_p = local_70;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_80,p_Var2[3]._M_left,
                           (long)&(p_Var2[3]._M_left)->_M_color +
                           (long)&(p_Var2[3]._M_right)->_M_color);
                std::vector<Item,_std::allocator<Item>_>::push_back
                          (__return_storage_ptr__,(Item *)local_d0);
                Item::~Item((Item *)local_d0);
                p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
              } while (p_Var2 != (_Rb_tree_node_base *)((long)&local_60 + 8U));
            }
          }
          std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>::
          ~_Rb_tree(&local_60);
          return __return_storage_ptr__;
        }
        std::__cxx11::list<Item,_std::allocator<Item>_>::list
                  ((list<Item,_std::allocator<Item>_> *)&local_60,
                   (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x58));
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((_List_node_base *)local_60._M_impl._0_8_ != (_List_node_base *)&local_60) {
          p_Var3 = (_List_node_base *)local_60._M_impl._0_8_;
          do {
            local_d0._0_4_ = *(undefined4 *)&p_Var3[1]._M_next;
            local_c8._M_p = local_b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,p_Var3[1]._M_prev,
                       (long)&(p_Var3[1]._M_prev)->_M_next + (long)&(p_Var3[2]._M_next)->_M_next);
            local_a8._M_p = local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,p_Var3[3]._M_prev,
                       (long)&(p_Var3[3]._M_prev)->_M_next + (long)p_Var3[4]._M_next);
            local_88 = (_Base_ptr)p_Var3[5]._M_prev;
            local_80._M_p = local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,p_Var3[6]._M_next,
                       (long)&(p_Var3[6]._M_prev)->_M_next + (long)p_Var3[6]._M_next);
            std::vector<Item,_std::allocator<Item>_>::push_back
                      (__return_storage_ptr__,(Item *)local_d0);
            Item::~Item((Item *)local_d0);
            p_Var3 = p_Var3->_M_next;
          } while (p_Var3 != (_List_node_base *)&local_60);
        }
      }
      std::__cxx11::_List_base<Item,_std::allocator<Item>_>::_M_clear
                ((_List_base<Item,_std::allocator<Item>_> *)&local_60);
      return __return_storage_ptr__;
    }
    __x = (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x58);
  }
  std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

vector<Item> getContent(Item item) {
	if (item.type == "Array") {
		return static_cast<Array *>(item.value)->content;
	}
	if (item.type == "MutableArray") {
		return static_cast<MutableArray *>(item.value)->content;
	}
	if (item.type == "ArrayList") {
		return static_cast<ArrayList *>(item.value)->content;
	}
	if (item.type == "MutableArrayList") {
		return static_cast<MutableArrayList *>(item.value)->content;
	}
	if (item.type == "List") {
		list<Item> l = static_cast<List *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableList") {
		list<Item> l = static_cast<MutableList *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "Set") {
		set<Item> s = static_cast<Set *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableSet") {
		set<Item> s = static_cast<MutableSet *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
}